

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

UObject * __thiscall
icu_63::ICUService::get
          (ICUService *this,UnicodeString *descriptor,UnicodeString *actualReturn,UErrorCode *status
          )

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ICUServiceKey *key;
  UObject *result;
  UErrorCode *status_local;
  UnicodeString *actualReturn_local;
  UnicodeString *descriptor_local;
  ICUService *this_local;
  long *plVar2;
  
  key = (ICUServiceKey *)0x0;
  iVar1 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xd])(this,descriptor,status);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    iVar1 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[7])(this,plVar2,actualReturn,status);
    key = (ICUServiceKey *)CONCAT44(extraout_var_00,iVar1);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  return &key->super_UObject;
}

Assistant:

UObject* 
ICUService::get(const UnicodeString& descriptor, UnicodeString* actualReturn, UErrorCode& status) const 
{
    UObject* result = NULL;
    ICUServiceKey* key = createKey(&descriptor, status);
    if (key) {
        result = getKey(*key, actualReturn, status);
        delete key;
    }
    return result;
}